

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exponentiation.cc
# Opt level: O0

int BN_exp(BIGNUM *r,BIGNUM *a,BIGNUM *p,BN_CTX *ctx)

{
  int iVar1;
  int iVar2;
  BIGNUM *pBVar3;
  BIGNUM *pBVar4;
  int local_54;
  int i;
  int bits;
  BIGNUM *v;
  BIGNUM *rr;
  BN_CTXScope scope;
  BN_CTX *ctx_local;
  BIGNUM *p_local;
  BIGNUM *a_local;
  BIGNUM *r_local;
  
  scope.ctx_ = (BN_CTX *)ctx;
  bssl::BN_CTXScope::BN_CTXScope((BN_CTXScope *)&rr,(BN_CTX *)ctx);
  if ((r == a) || (v = (BIGNUM *)r, r == p)) {
    v = (BIGNUM *)BN_CTX_get((BN_CTX *)scope.ctx_);
  }
  pBVar3 = BN_CTX_get((BN_CTX *)scope.ctx_);
  if ((v == (BIGNUM *)0x0) || (pBVar3 == (BIGNUM *)0x0)) {
    r_local._4_4_ = 0;
  }
  else {
    pBVar4 = BN_copy(pBVar3,a);
    if (pBVar4 == (BIGNUM *)0x0) {
      r_local._4_4_ = 0;
    }
    else {
      iVar1 = BN_num_bits(p);
      iVar2 = BN_is_odd((BIGNUM *)p);
      if (iVar2 == 0) {
        iVar2 = BN_one(v);
        if (iVar2 == 0) {
          r_local._4_4_ = 0;
          goto LAB_006ccaf6;
        }
      }
      else {
        pBVar4 = BN_copy((BIGNUM *)v,a);
        if (pBVar4 == (BIGNUM *)0x0) {
          r_local._4_4_ = 0;
          goto LAB_006ccaf6;
        }
      }
      for (local_54 = 1; local_54 < iVar1; local_54 = local_54 + 1) {
        iVar2 = BN_sqr(pBVar3,pBVar3,(BN_CTX *)scope.ctx_);
        if (iVar2 == 0) {
          r_local._4_4_ = 0;
          goto LAB_006ccaf6;
        }
        iVar2 = BN_is_bit_set(p,local_54);
        if ((iVar2 != 0) &&
           (iVar2 = BN_mul((BIGNUM *)v,(BIGNUM *)v,pBVar3,(BN_CTX *)scope.ctx_), iVar2 == 0)) {
          r_local._4_4_ = 0;
          goto LAB_006ccaf6;
        }
      }
      if ((r == (BIGNUM *)v) || (pBVar3 = BN_copy(r,(BIGNUM *)v), pBVar3 != (BIGNUM *)0x0)) {
        r_local._4_4_ = 1;
      }
      else {
        r_local._4_4_ = 0;
      }
    }
  }
LAB_006ccaf6:
  bssl::BN_CTXScope::~BN_CTXScope((BN_CTXScope *)&rr);
  return r_local._4_4_;
}

Assistant:

int BN_exp(BIGNUM *r, const BIGNUM *a, const BIGNUM *p, BN_CTX *ctx) {
  bssl::BN_CTXScope scope(ctx);
  BIGNUM *rr;
  if (r == a || r == p) {
    rr = BN_CTX_get(ctx);
  } else {
    rr = r;
  }

  BIGNUM *v = BN_CTX_get(ctx);
  if (rr == NULL || v == NULL) {
    return 0;
  }

  if (BN_copy(v, a) == NULL) {
    return 0;
  }
  int bits = BN_num_bits(p);

  if (BN_is_odd(p)) {
    if (BN_copy(rr, a) == NULL) {
      return 0;
    }
  } else {
    if (!BN_one(rr)) {
      return 0;
    }
  }

  for (int i = 1; i < bits; i++) {
    if (!BN_sqr(v, v, ctx)) {
      return 0;
    }
    if (BN_is_bit_set(p, i)) {
      if (!BN_mul(rr, rr, v, ctx)) {
        return 0;
      }
    }
  }

  if (r != rr && !BN_copy(r, rr)) {
    return 0;
  }
  return 1;
}